

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x2x.cc
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_2019::DataTransform<signed_char,_float>::Run
          (DataTransform<signed_char,_float> *this,istream *input_stream)

{
  float fVar1;
  NumericType NVar2;
  WarningType WVar3;
  ulong uVar4;
  ostream *poVar5;
  size_t *__idx;
  int iVar6;
  bool bVar7;
  ushort in_FPUControlWord;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble in_ST7;
  float fVar8;
  char input_data;
  ushort local_280;
  short local_27e;
  short local_27c;
  allocator local_279;
  float local_278;
  float local_274;
  string *local_270;
  undefined1 local_268 [16];
  string local_250;
  string word;
  char buffer [128];
  
  local_270 = &this->print_format_;
  iVar6 = 0;
  do {
    if (this->is_ascii_input_ == true) {
      word._M_dataplus._M_p = (pointer)&word.field_2;
      word._M_string_length = 0;
      word.field_2._M_local_buf[0] = '\0';
      std::operator>>(input_stream,(string *)&word);
      bVar7 = word._M_string_length == 0;
      if (!bVar7) {
        std::__cxx11::stold((longdouble *)&word,(string *)0x0,__idx);
        local_280 = in_FPUControlWord | 0xc00;
        local_27c = (short)ROUND(in_ST0);
        input_data = (char)local_27c;
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
        in_ST5 = in_ST6;
        in_ST6 = in_ST7;
      }
      std::__cxx11::string::~string((string *)&word);
      if (!bVar7) goto LAB_00113848;
      if (bVar7) {
        if (!bVar7) {
          return false;
        }
        goto LAB_00113a84;
      }
    }
    else {
      bVar7 = sptk::ReadStream<signed_char>(&input_data,input_stream);
      if (!bVar7) {
LAB_00113a84:
        if (this->is_ascii_output_ != true) {
          return true;
        }
        if (iVar6 % this->num_column_ != 0) {
          std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          return true;
        }
        return true;
      }
LAB_00113848:
      uVar4 = (ulong)input_data;
      fVar8 = this->minimum_value_;
      fVar1 = this->maximum_value_;
      if (fVar1 <= fVar8) {
LAB_001139c5:
        in_ST7 = in_ST6;
        if (this->rounding_ == true) {
          fVar8 = (float)(int)input_data;
          if (input_data < '\x01') {
            fVar8 = fVar8 + -0.5;
          }
          else {
            fVar8 = fVar8 + 0.5;
          }
        }
        else {
          fVar8 = (float)(int)input_data;
        }
      }
      else {
        NVar2 = this->input_numeric_type_;
        if (NVar2 == kFloatingPoint) {
          local_27e = (short)input_data;
          in_ST6 = in_ST5;
          local_274 = fVar8;
          if (((float)local_27e < fVar8) ||
             (fVar8 = fVar1, local_278 = fVar1, fVar1 < (float)local_27e)) goto LAB_0011394c;
          goto LAB_001139c5;
        }
        if (NVar2 == kUnsignedInteger) {
          if (((ulong)((long)(fVar8 - 9.223372e+18) & (long)fVar8 >> 0x3f | (long)fVar8) <= uVar4)
             && (fVar8 = fVar1,
                uVar4 <= (ulong)((long)(fVar1 - 9.223372e+18) & (long)fVar1 >> 0x3f | (long)fVar1)))
          goto LAB_001139c5;
        }
        else if ((NVar2 != kSignedInteger) ||
                (((long)fVar8 <= (long)uVar4 && (fVar8 = fVar1, (long)uVar4 <= (long)fVar1))))
        goto LAB_001139c5;
LAB_0011394c:
        in_ST7 = in_ST6;
        if (this->warning_type_ != kIgnore) {
          local_268 = ZEXT416((uint)fVar8);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&word);
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)&word,iVar6);
          std::operator<<(poVar5,"th data is over the range of output type");
          std::__cxx11::string::string((string *)&local_250,"x2x",&local_279);
          sptk::PrintErrorMessage(&local_250,(ostringstream *)&word);
          std::__cxx11::string::~string((string *)&local_250);
          WVar3 = this->warning_type_;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&word);
          fVar8 = (float)local_268._0_4_;
          if (WVar3 == kExit) {
            return false;
          }
        }
      }
      if (this->is_ascii_output_ == true) {
        bVar7 = sptk::SnPrintf<float>(fVar8,local_270,0x80,buffer);
        if (!bVar7) {
          return false;
        }
        std::operator<<((ostream *)&std::cout,buffer);
        if ((iVar6 + 1) % this->num_column_ == 0) {
          std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        }
        else {
          std::operator<<((ostream *)&std::cout,"\t");
        }
      }
      else {
        bVar7 = sptk::WriteStream<float>(fVar8,(ostream *)&std::cout);
        if (!bVar7) {
          return false;
        }
      }
    }
    iVar6 = iVar6 + 1;
  } while( true );
}

Assistant:

bool Run(std::istream* input_stream) const override {
    char buffer[kBufferSize];
    int index(0);
    for (;; ++index) {
      // Read.
      T1 input_data;
      if (is_ascii_input_) {
        std::string word;
        *input_stream >> word;
        if (word.empty()) break;
        try {
          input_data = static_cast<T1>(std::stold(word));
        } catch (std::invalid_argument&) {
          return false;
        }
      } else {
        if (!sptk::ReadStream(&input_data, input_stream)) {
          break;
        }
      }

      // Convert.
      T2 output_data(static_cast<T2>(input_data));

      bool is_clipped(false);
      {
        // Clipping.
        if (minimum_value_ < maximum_value_) {
          if (kSignedInteger == input_numeric_type_) {
            if (static_cast<std::int64_t>(input_data) <
                static_cast<std::int64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::int64_t>(maximum_value_) <
                       static_cast<std::int64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kUnsignedInteger == input_numeric_type_) {
            if (static_cast<std::uint64_t>(input_data) <
                static_cast<std::uint64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::uint64_t>(maximum_value_) <
                       static_cast<std::uint64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kFloatingPoint == input_numeric_type_) {
            if (static_cast<long double>(input_data) <
                static_cast<long double>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<long double>(maximum_value_) <
                       static_cast<long double>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          }
        }

        // Rounding.
        if (rounding_ && !is_clipped) {
          if (0.0 < input_data) {
            output_data = static_cast<T2>(input_data + 0.5);
          } else {
            output_data = static_cast<T2>(input_data - 0.5);
          }
        }
      }

      if (is_clipped && kIgnore != warning_type_) {
        std::ostringstream error_message;
        error_message << index << "th data is over the range of output type";
        sptk::PrintErrorMessage("x2x", error_message);
        if (kExit == warning_type_) return false;
      }

      // Write output.
      if (is_ascii_output_) {
        if (!sptk::SnPrintf(output_data, print_format_, sizeof(buffer),
                            buffer)) {
          return false;
        }
        std::cout << buffer;
        if (0 == (index + 1) % num_column_) {
          std::cout << std::endl;
        } else {
          std::cout << "\t";
        }
      } else {
        if (!sptk::WriteStream(output_data, &std::cout)) {
          return false;
        }
      }
    }

    if (is_ascii_output_ && 0 != index % num_column_) {
      std::cout << std::endl;
    }

    return true;
  }